

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_search_smaller(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  int iVar1;
  code *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int cmp;
  avl_node *pp;
  avl_node *p;
  avl_node *local_30;
  avl_node *local_28;
  avl_node *local_8;
  
  local_28 = (avl_node *)*in_RDI;
  local_30 = (avl_node *)0x0;
  while( true ) {
    while( true ) {
      if (local_28 == (avl_node *)0x0) {
        if (local_30 == (avl_node *)0x0) {
          local_8 = local_30;
        }
        else {
          iVar1 = (*in_RDX)(local_30,in_RSI,in_RDI[1]);
          if (iVar1 < 0) {
            local_8 = local_30;
          }
          else {
            local_8 = avl_prev(local_30);
          }
        }
        return local_8;
      }
      iVar1 = (*in_RDX)(local_28,in_RSI,in_RDI[1]);
      local_30 = local_28;
      if (iVar1 < 1) break;
      local_28 = local_28->left;
    }
    if (-1 < iVar1) break;
    local_28 = local_28->right;
  }
  return local_28;
}

Assistant:

struct avl_node* avl_search_smaller(struct avl_tree *tree,
                                    struct avl_node *node,
                                    avl_cmp_func *func)
// if an exact match does not exist,
// return greatest node smaller than NODE
{
    struct avl_node *p = tree->root;
    struct avl_node *pp = NULL;
    int cmp;

    while(p)
    {
        cmp = func(p, node, tree->aux);
        pp = p;

        if (cmp > 0) {
            p = p->left;
        }else if (cmp < 0){
            p = p->right;
        }else {
            // search success
            return p;
        }
    }

    if (!pp) {
        return pp;
    }

    cmp = func(pp, node, tree->aux);
    if (cmp < 0) {
        return pp;
    }else{
        return avl_prev(pp);
    }
}